

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::SetScriptModeFile(cmMakefile *this,char *scriptfile)

{
  allocator local_39;
  string local_38;
  char *local_18;
  char *scriptfile_local;
  cmMakefile *this_local;
  
  local_18 = scriptfile;
  scriptfile_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_SCRIPT_MODE_FILE",&local_39);
  AddDefinition(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void cmMakefile::SetScriptModeFile(const char* scriptfile)
{
  this->AddDefinition("CMAKE_SCRIPT_MODE_FILE", scriptfile);
}